

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  LogMessage *pLVar5;
  void **ppvVar6;
  MessageOptions *this_00;
  Arena *pAVar7;
  undefined1 *from_00;
  int iVar8;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.cc"
               ,0xcd5);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  pvVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->field_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->field_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->field_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->field_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->field_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->field_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->field_).super_RepeatedPtrFieldBase.current_size_;
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             &(from->nested_type_).super_RepeatedPtrFieldBase);
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->enum_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
              (&(this->enum_type_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->extension_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
              (&(this->extension_range_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->extension_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->extension_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->extension_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->extension_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->extension_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
              (&(this->oneof_decl_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
    (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6fb);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=(&local_31,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  iVar8 = (from->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    pRVar3 = (from->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar8);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
              (&(this->reserved_range_).super_RepeatedPtrFieldBase,ppvVar6,pRVar3->elements,iVar8,
               ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar8 = iVar8 + (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar8;
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar8) {
      pRVar3->allocated_size = iVar8;
    }
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(from->reserved_name_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      initial_value = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar7 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      psVar4 = (this->name_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar7,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->options_;
      if (this_00 == (MessageOptions *)0x0) {
        pAVar7 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
        }
        this_00 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar7);
        this->options_ = this_00;
      }
      from_00 = (undefined1 *)from->options_;
      if ((MessageOptions *)from_00 == (MessageOptions *)0x0) {
        from_00 = _MessageOptions_default_instance_;
      }
      MessageOptions::MergeFrom(this_00,(MessageOptions *)from_00);
    }
  }
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  field_.MergeFrom(from.field_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  extension_.MergeFrom(from.extension_);
  oneof_decl_.MergeFrom(from.oneof_decl_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::MessageOptions::MergeFrom(from._internal_options());
    }
  }
}